

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TrackEventDescriptor::ParseFromArray
          (TrackEventDescriptor *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  uint8_t cur_byte;
  ulong *puVar10;
  ulong *puVar11;
  uint uVar12;
  uint8_t cur_byte_1;
  uint8_t cur_byte_3;
  ulong *puVar13;
  uint8_t cur_byte_2;
  ulong uVar14;
  pointer pTVar15;
  Field local_40;
  
  pTVar2 = (this->available_categories_).
           super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->available_categories_).
           super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar15 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**(pTVar15->super_CppMessageObj)._vptr_CppMessageObj)(pTVar15);
      pTVar15 = pTVar15 + 1;
    } while (pTVar15 != pTVar3);
    (this->available_categories_).
    super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  local_40.int_value_ = 0;
LAB_0022e38c:
  lVar7 = 7;
  if (puVar9 <= raw) goto switchD_0022e3da_caseD_3;
  bVar1 = (byte)*raw;
  uVar5 = (ulong)bVar1;
  puVar13 = (ulong *)((long)raw + 1);
  if ((char)bVar1 < '\0') {
    uVar5 = (ulong)(bVar1 & 0x7f);
    do {
      if ((puVar9 <= puVar13) || (0x38 < lVar7 - 7U)) goto switchD_0022e3da_caseD_3;
      uVar14 = *puVar13;
      puVar13 = (ulong *)((long)puVar13 + 1);
      uVar5 = uVar5 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
      lVar7 = lVar7 + 7;
    } while ((char)(byte)uVar14 < '\0');
  }
  uVar12 = (uint)(uVar5 >> 3);
  if ((uVar12 == 0) || (puVar9 <= puVar13)) goto switchD_0022e3da_caseD_3;
  switch((uint)uVar5 & 7) {
  case 0:
    uVar14 = 0;
    uVar6 = 0;
    while( true ) {
      puVar10 = (ulong *)((long)puVar13 + 1);
      uVar14 = (ulong)((byte)*puVar13 & 0x7f) << ((byte)uVar6 & 0x3f) | uVar14;
      if (-1 < (char)(byte)*puVar13) break;
      if ((puVar9 <= puVar10) || (bVar4 = 0x38 < uVar6, uVar6 = uVar6 + 7, puVar13 = puVar10, bVar4)
         ) goto switchD_0022e3da_caseD_3;
    }
    uVar6 = uVar14 & 0xffffffff00000000;
    uVar8 = 0;
LAB_0022e4ea:
    raw = puVar10;
    if ((uVar12 < 0x10000) && (uVar8 < 0x10000000)) {
      local_40.int_value_ = uVar6 | uVar14 & 0xffffffff;
      uVar5 = uVar8 | (uVar5 >> 3) << 0x20 | (uVar5 & 7) << 0x30;
LAB_0022e572:
      local_40.size_ = (uint32_t)uVar5;
      local_40.type_ = (uint8_t)(uVar5 >> 0x30);
      local_40.id_ = (uint16_t)(uVar5 >> 0x20);
      puVar13 = puVar10;
      if (local_40.id_ == 1) {
        *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
        std::
        vector<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
        ::emplace_back<>(&this->available_categories_);
        pTVar2 = (this->available_categories_).
                 super__Vector_base<perfetto::protos::gen::TrackEventCategory,_std::allocator<perfetto::protos::gen::TrackEventCategory>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (*pTVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                  (pTVar2 + -1,local_40.int_value_,(ulong)local_40.size_);
      }
      else {
        if ((uVar5 & 0xffff00000000) == 0) {
          return puVar9 == puVar10;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_40,&this->unknown_fields_);
      }
LAB_0022e63f:
      if (puVar9 <= puVar13) goto switchD_0022e688_caseD_3;
      bVar1 = (byte)*puVar13;
      uVar5 = (ulong)(uint)bVar1;
      puVar11 = (ulong *)((long)puVar13 + 1);
      if ((char)bVar1 < '\0') {
        uVar5 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_0022e688_caseD_3;
          uVar14 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar5 = uVar5 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar14 < '\0');
      }
      uVar12 = (uint)(uVar5 >> 3);
      if ((uVar12 == 0) || (puVar9 <= puVar11)) goto switchD_0022e688_caseD_3;
      switch((uint)uVar5 & 7) {
      case 0:
        uVar14 = 0;
        uVar6 = 0;
        while( true ) {
          puVar10 = (ulong *)((long)puVar11 + 1);
          uVar14 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar6 & 0x3f) | uVar14;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar9 <= puVar10) ||
             (bVar4 = 0x38 < uVar6, uVar6 = uVar6 + 7, puVar11 = puVar10, bVar4))
          goto switchD_0022e688_caseD_3;
        }
        local_40.int_value_ = uVar14 & 0xffffffff00000000;
LAB_0022e75b:
        uVar6 = 0;
LAB_0022e75d:
        puVar13 = puVar10;
        if ((0xffff < uVar12) || (0xfffffff < uVar6)) goto LAB_0022e63f;
        local_40.int_value_ = local_40.int_value_ | uVar14 & 0xffffffff;
        uVar5 = uVar6 | (uVar5 >> 3) << 0x20 | (uVar5 & 7) << 0x30;
        goto LAB_0022e572;
      case 1:
        puVar10 = puVar11 + 1;
        if (puVar10 <= puVar9) {
          uVar14 = *puVar11;
          local_40.int_value_ = uVar14 & 0xffffffff00000000;
          goto LAB_0022e75b;
        }
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar6 = 0;
        uVar14 = 0;
        puVar10 = puVar11;
        while (uVar6 = (ulong)(*(byte *)((long)puVar10 + -1) & 0x7f) << ((byte)uVar14 & 0x3f) |
                       uVar6, (char)*(byte *)((long)puVar10 + -1) < '\0') {
          if (puVar9 <= puVar10) goto switchD_0022e688_caseD_3;
          puVar10 = (ulong *)((long)puVar10 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar4 = 0x38 < uVar14;
          uVar14 = uVar14 + 7;
          if (bVar4) goto switchD_0022e688_caseD_3;
        }
        if (uVar6 <= (ulong)((long)puVar9 - (long)puVar11)) {
          local_40.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar10 = (ulong *)((long)puVar10 + uVar6);
          uVar14 = (ulong)puVar11 & 0xffffffff;
          goto LAB_0022e75d;
        }
        break;
      case 5:
        puVar10 = (ulong *)((long)puVar11 + 4);
        if (puVar10 <= puVar9) {
          uVar14 = (ulong)(uint)*puVar11;
          local_40.int_value_ = 0;
          goto LAB_0022e75b;
        }
      }
switchD_0022e688_caseD_3:
      local_40.int_value_ = 0;
      uVar5 = 0;
      puVar10 = puVar13;
      goto LAB_0022e572;
    }
    goto LAB_0022e38c;
  case 1:
    puVar10 = puVar13 + 1;
    if (puVar10 <= puVar9) {
      uVar14 = *puVar13;
      uVar6 = uVar14 & 0xffffffff00000000;
LAB_0022e457:
      uVar8 = 0;
      goto LAB_0022e4ea;
    }
    break;
  case 2:
    puVar13 = (ulong *)((long)puVar13 + 1);
    uVar8 = 0;
    uVar14 = 0;
    puVar11 = puVar13;
    while (uVar8 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar14 & 0x3f) | uVar8,
          (char)*(byte *)((long)puVar13 + -1) < '\0') {
      if (puVar9 <= puVar13) goto switchD_0022e3da_caseD_3;
      puVar13 = (ulong *)((long)puVar13 + 1);
      puVar11 = (ulong *)((long)puVar11 + 1);
      bVar4 = 0x38 < uVar14;
      uVar14 = uVar14 + 7;
      if (bVar4) goto switchD_0022e3da_caseD_3;
    }
    if (uVar8 <= (ulong)((long)puVar9 - (long)puVar11)) {
      uVar6 = (ulong)puVar11 & 0xffffffff00000000;
      puVar10 = (ulong *)((long)puVar13 + uVar8);
      uVar14 = (ulong)puVar11 & 0xffffffff;
      goto LAB_0022e4ea;
    }
    break;
  case 5:
    puVar10 = (ulong *)((long)puVar13 + 4);
    if (puVar10 <= puVar9) {
      uVar14 = (ulong)(uint)*puVar13;
      uVar6 = 0;
      goto LAB_0022e457;
    }
  }
switchD_0022e3da_caseD_3:
  uVar5 = 0;
  puVar10 = (ulong *)raw;
  goto LAB_0022e572;
}

Assistant:

bool TrackEventDescriptor::ParseFromArray(const void* raw, size_t size) {
  available_categories_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* available_categories */:
        available_categories_.emplace_back();
        available_categories_.back().ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}